

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_tree.cc
# Opt level: O0

void memory_tree_ns::save_load_node
               (node *cn,io_buf *model_file,bool *read,bool *text,stringstream *msg)

{
  ostream *poVar1;
  char *read_message;
  uint *puVar2;
  byte *in_RCX;
  io_buf *in_RDX;
  undefined8 in_RSI;
  uint *in_RDI;
  size_t in_R8;
  uint32_t k_1;
  uint32_t k;
  size_t leaf_n_examples;
  undefined4 in_stack_ffffffffffffffac;
  v_array<unsigned_int> *in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  undefined1 uVar3;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  uint uVar4;
  uint in_stack_ffffffffffffffcc;
  char *in_stack_ffffffffffffffd0;
  
  uVar3 = (undefined1)((ulong)in_stack_ffffffffffffffb8 >> 0x38);
  poVar1 = std::operator<<((ostream *)(in_R8 + 0x10),"parent");
  poVar1 = std::operator<<(poVar1," = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*in_RDI);
  std::operator<<(poVar1," ");
  bin_text_read_write_fixed
            (in_RDX,(char *)in_RCX,in_R8,in_stack_ffffffffffffffd0,
             SUB41(in_stack_ffffffffffffffcc >> 0x18,0),
             (stringstream *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             (bool)uVar3);
  poVar1 = std::operator<<((ostream *)(in_R8 + 0x10),"internal");
  poVar1 = std::operator<<(poVar1," = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RDI[1]);
  std::operator<<(poVar1," ");
  bin_text_read_write_fixed
            (in_RDX,(char *)in_RCX,in_R8,in_stack_ffffffffffffffd0,
             SUB41(in_stack_ffffffffffffffcc >> 0x18,0),
             (stringstream *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             (bool)uVar3);
  poVar1 = std::operator<<((ostream *)(in_R8 + 0x10),"depth");
  poVar1 = std::operator<<(poVar1," = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RDI[2]);
  std::operator<<(poVar1," ");
  bin_text_read_write_fixed
            (in_RDX,(char *)in_RCX,in_R8,in_stack_ffffffffffffffd0,
             SUB41(in_stack_ffffffffffffffcc >> 0x18,0),
             (stringstream *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             (bool)uVar3);
  poVar1 = std::operator<<((ostream *)(in_R8 + 0x10),"base_router");
  poVar1 = std::operator<<(poVar1," = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RDI[3]);
  std::operator<<(poVar1," ");
  bin_text_read_write_fixed
            (in_RDX,(char *)in_RCX,in_R8,in_stack_ffffffffffffffd0,
             SUB41(in_stack_ffffffffffffffcc >> 0x18,0),
             (stringstream *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             (bool)uVar3);
  poVar1 = std::operator<<((ostream *)(in_R8 + 0x10),"left");
  poVar1 = std::operator<<(poVar1," = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RDI[4]);
  std::operator<<(poVar1," ");
  bin_text_read_write_fixed
            (in_RDX,(char *)in_RCX,in_R8,in_stack_ffffffffffffffd0,
             SUB41(in_stack_ffffffffffffffcc >> 0x18,0),
             (stringstream *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             (bool)uVar3);
  poVar1 = std::operator<<((ostream *)(in_R8 + 0x10),"right");
  poVar1 = std::operator<<(poVar1," = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RDI[5]);
  std::operator<<(poVar1," ");
  bin_text_read_write_fixed
            (in_RDX,(char *)in_RCX,in_R8,in_stack_ffffffffffffffd0,
             SUB41(in_stack_ffffffffffffffcc >> 0x18,0),
             (stringstream *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             (bool)uVar3);
  poVar1 = std::operator<<((ostream *)(in_R8 + 0x10),"nl");
  poVar1 = std::operator<<(poVar1," = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(double *)(in_RDI + 6));
  std::operator<<(poVar1," ");
  bin_text_read_write_fixed
            (in_RDX,(char *)in_RCX,in_R8,in_stack_ffffffffffffffd0,
             SUB41(in_stack_ffffffffffffffcc >> 0x18,0),
             (stringstream *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             (bool)uVar3);
  poVar1 = std::operator<<((ostream *)(in_R8 + 0x10),"nr");
  poVar1 = std::operator<<(poVar1," = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(double *)(in_RDI + 8));
  std::operator<<(poVar1," ");
  bin_text_read_write_fixed
            (in_RDX,(char *)in_RCX,in_R8,in_stack_ffffffffffffffd0,
             SUB41(in_stack_ffffffffffffffcc >> 0x18,0),
             (stringstream *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             (bool)uVar3);
  read_message = (char *)v_array<unsigned_int>::size((v_array<unsigned_int> *)(in_RDI + 10));
  poVar1 = std::operator<<((ostream *)(in_R8 + 0x10),"leaf_n_examples");
  poVar1 = std::operator<<(poVar1," = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(ulong)read_message);
  std::operator<<(poVar1," ");
  uVar4 = (uint)(*in_RCX & 1);
  bin_text_read_write_fixed
            (in_RDX,(char *)in_RCX,in_R8,read_message,SUB41(in_stack_ffffffffffffffcc >> 0x18,0),
             (stringstream *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             (bool)uVar3);
  if (((ulong)in_RDX->_vptr_io_buf & 1) != 0) {
    v_array<unsigned_int>::clear(in_stack_ffffffffffffffb0);
    for (in_stack_ffffffffffffffcc = 0; (char *)(ulong)in_stack_ffffffffffffffcc < read_message;
        in_stack_ffffffffffffffcc = in_stack_ffffffffffffffcc + 1) {
      v_array<unsigned_int>::push_back
                (in_stack_ffffffffffffffb0,(uint *)CONCAT44(in_stack_ffffffffffffffac,uVar4));
    }
  }
  for (uVar4 = 0; (char *)(ulong)uVar4 < read_message; uVar4 = uVar4 + 1) {
    poVar1 = std::operator<<((ostream *)(in_R8 + 0x10),"example_location");
    poVar1 = std::operator<<(poVar1," = ");
    puVar2 = v_array<unsigned_int>::operator[]((v_array<unsigned_int> *)(in_RDI + 10),(ulong)uVar4);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*puVar2);
    std::operator<<(poVar1," ");
    uVar3 = (char)((ulong)in_RSI >> 0x38);
    v_array<unsigned_int>::operator[]((v_array<unsigned_int> *)(in_RDI + 10),(ulong)uVar4);
    bin_text_read_write_fixed
              (in_RDX,(char *)in_RCX,in_R8,read_message,SUB41(in_stack_ffffffffffffffcc >> 0x18,0),
               (stringstream *)CONCAT44(uVar4,in_stack_ffffffffffffffc0),(bool)uVar3);
  }
  return;
}

Assistant:

void save_load_node(node& cn, io_buf& model_file, bool& read, bool& text, stringstream& msg)
    {
        writeit(cn.parent, "parent");
        writeit(cn.internal, "internal");
        writeit(cn.depth, "depth");
        writeit(cn.base_router, "base_router");
        writeit(cn.left, "left");
        writeit(cn.right, "right");
        writeit(cn.nl, "nl");
        writeit(cn.nr, "nr");
        writeitvar(cn.examples_index.size(), "leaf_n_examples", leaf_n_examples);
        if (read){
            cn.examples_index.clear();
            for (uint32_t k = 0; k < leaf_n_examples; k++)
                    cn.examples_index.push_back(0);
        }
        for (uint32_t k = 0; k < leaf_n_examples; k++)
            writeit(cn.examples_index[k], "example_location");
    }